

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

ASN1_STRING * bn_to_asn1_string(BIGNUM *bn,ASN1_STRING *ai,int type)

{
  int iVar1;
  uint uVar2;
  ASN1_STRING *pAStack_30;
  int len;
  ASN1_INTEGER *ret;
  int type_local;
  ASN1_STRING *ai_local;
  BIGNUM *bn_local;
  
  pAStack_30 = ai;
  if (ai == (ASN1_STRING *)0x0) {
    pAStack_30 = (ASN1_STRING *)ASN1_STRING_type_new(type);
  }
  if (pAStack_30 == (ASN1_STRING *)0x0) {
    ERR_put_error(0xc,0,0x9e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x182);
  }
  else {
    iVar1 = BN_is_negative(bn);
    if ((iVar1 == 0) || (iVar1 = BN_is_zero(bn), iVar1 != 0)) {
      pAStack_30->type = type;
    }
    else {
      pAStack_30->type = type | 0x100;
    }
    uVar2 = BN_num_bytes(bn);
    iVar1 = ASN1_STRING_set(pAStack_30,(void *)0x0,(long)(int)uVar2);
    if ((iVar1 != 0) && (iVar1 = BN_bn2bin_padded(pAStack_30->data,(long)(int)uVar2,bn), iVar1 != 0)
       ) {
      return pAStack_30;
    }
  }
  if (pAStack_30 != ai) {
    ASN1_STRING_free((ASN1_STRING *)pAStack_30);
  }
  return (ASN1_STRING *)0x0;
}

Assistant:

static ASN1_STRING *bn_to_asn1_string(const BIGNUM *bn, ASN1_STRING *ai,
                                      int type) {
  ASN1_INTEGER *ret;
  if (ai == NULL) {
    ret = ASN1_STRING_type_new(type);
  } else {
    ret = ai;
  }
  int len;
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
    goto err;
  }

  if (BN_is_negative(bn) && !BN_is_zero(bn)) {
    ret->type = type | V_ASN1_NEG;
  } else {
    ret->type = type;
  }

  len = BN_num_bytes(bn);
  if (!ASN1_STRING_set(ret, NULL, len) ||
      !BN_bn2bin_padded(ret->data, len, bn)) {
    goto err;
  }
  return ret;

err:
  if (ret != ai) {
    ASN1_STRING_free(ret);
  }
  return NULL;
}